

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::FederateState::receiveAny(FederateState *this,InterfaceHandle *hid)

{
  pointer puVar1;
  undefined4 uVar2;
  Time TVar3;
  undefined4 *in_RDX;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *end_point;
  pointer puVar4;
  Time TVar5;
  Time maxTime;
  handle elock;
  handle local_48;
  
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(&local_48,
         (shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          *)(hid + 0x42));
  puVar1 = ((local_48.data)->dataStorage).
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  TVar5.internalTimeCode = 0x7fffffffffffffff;
  maxTime.internalTimeCode = 0;
  for (puVar4 = ((local_48.data)->dataStorage).
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    TVar3 = EndpointInfo::firstMessageTime
                      ((puVar4->_M_t).
                       super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                       .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl);
    if (TVar3.internalTimeCode < TVar5.internalTimeCode) {
      maxTime.internalTimeCode =
           (baseType)
           (puVar4->_M_t).
           super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>.
           _M_t.
           super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
           .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl;
      TVar5 = TVar3;
    }
  }
  if (maxTime.internalTimeCode != 0) {
    if (TVar5.internalTimeCode <= *(long *)(hid + 0x142)) {
      EndpointInfo::getMessage((EndpointInfo *)this,maxTime);
      if ((this->name)._M_dataplus._M_p == (pointer)0x0) {
        uVar2 = 0x9aac0f00;
      }
      else {
        uVar2 = *(undefined4 *)(maxTime.internalTimeCode + 4);
      }
      *in_RDX = uVar2;
      goto LAB_00262528;
    }
    *in_RDX = 0x9aac0f00;
  }
  (this->name)._M_dataplus._M_p = (pointer)0x0;
LAB_00262528:
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> FederateState::receiveAny(InterfaceHandle& hid)
{
    Time earliest_time = Time::maxVal();
    EndpointInfo* endpointI = nullptr;
    auto elock = interfaceInformation.getEndpoints();
    // Find the end point with the earliest message time
    for (const auto& end_point : elock) {
        auto firstTime = end_point->firstMessageTime();
        if (firstTime < earliest_time) {
            earliest_time = firstTime;
            endpointI = end_point.get();
        }
    }
    if (endpointI == nullptr) {
        return nullptr;
    }
    // Return the message found and remove from the queue
    if (earliest_time <= time_granted) {
        auto result = endpointI->getMessage(time_granted);
        hid = (result) ? endpointI->id.handle : InterfaceHandle{};

        return result;
    }
    hid = InterfaceHandle();
    return nullptr;
}